

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool flatbuffers::DeserializeAttributesCommon
               (SymbolTable<flatbuffers::Value> *attributes,Parser *parser,
               Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs)

{
  uint uVar1;
  Parser *this;
  bool bVar2;
  uint uVar3;
  Value *pVVar4;
  String *pSVar5;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *this_00;
  string local_b0;
  string local_90;
  string local_70;
  Value *local_40;
  Value *value;
  return_type kv;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVStack_28;
  uoffset_t i;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs_local;
  Parser *parser_local;
  SymbolTable<flatbuffers::Value> *attributes_local;
  
  if (attrs != (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0) {
    pVStack_28 = attrs;
    attrs_local = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)parser;
    parser_local = (Parser *)attributes;
    for (kv._4_4_ = 0; uVar1 = kv._4_4_,
        uVar3 = Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>::size(pVStack_28),
        uVar1 < uVar3; kv._4_4_ = kv._4_4_ + 1) {
      value = (Value *)Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>::Get
                                 (pVStack_28,kv._4_4_);
      pVVar4 = (Value *)operator_new(0x48);
      Value::Value(pVVar4);
      local_40 = pVVar4;
      pSVar5 = reflection::KeyValue::value((KeyValue *)value);
      if (pSVar5 != (String *)0x0) {
        pSVar5 = reflection::KeyValue::value((KeyValue *)value);
        String::str_abi_cxx11_(&local_70,pSVar5);
        std::__cxx11::string::operator=((string *)&local_40->constant,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      this = parser_local;
      pSVar5 = reflection::KeyValue::key((KeyValue *)value);
      String::str_abi_cxx11_(&local_90,pSVar5);
      bVar2 = SymbolTable<flatbuffers::Value>::Add
                        ((SymbolTable<flatbuffers::Value> *)this,&local_90,local_40);
      std::__cxx11::string::~string((string *)&local_90);
      pVVar4 = local_40;
      if (bVar2) {
        if (local_40 != (Value *)0x0) {
          Value::~Value(local_40);
          operator_delete(pVVar4,0x48);
        }
        return false;
      }
      this_00 = attrs_local + 0x3b8;
      pSVar5 = reflection::KeyValue::key((KeyValue *)value);
      String::str_abi_cxx11_(&local_b0,pSVar5);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                    *)this_00,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  return true;
}

Assistant:

static bool DeserializeAttributesCommon(
    SymbolTable<Value> &attributes, Parser &parser,
    const Vector<Offset<reflection::KeyValue>> *attrs) {
  if (attrs == nullptr) return true;
  for (uoffset_t i = 0; i < attrs->size(); ++i) {
    auto kv = attrs->Get(i);
    auto value = new Value();
    if (kv->value()) { value->constant = kv->value()->str(); }
    if (attributes.Add(kv->key()->str(), value)) {
      delete value;
      return false;
    }
    parser.known_attributes_[kv->key()->str()];
  }
  return true;
}